

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

void lz_encoder_end(void *coder_ptr,lzma_allocator *allocator)

{
  lzma_next_end((lzma_next_coder *)((long)coder_ptr + 0x98),allocator);
  lzma_free(*(void **)((long)coder_ptr + 0x68),allocator);
  lzma_free(*(void **)((long)coder_ptr + 0x60),allocator);
  lzma_free(*(void **)((long)coder_ptr + 0x20),allocator);
  if (*(code **)((long)coder_ptr + 0x10) == (code *)0x0) {
    lzma_free(*coder_ptr,allocator);
  }
  else {
    (**(code **)((long)coder_ptr + 0x10))();
  }
  lzma_free(coder_ptr,allocator);
  return;
}

Assistant:

static void
lz_encoder_end(void *coder_ptr, const lzma_allocator *allocator)
{
	lzma_coder *coder = coder_ptr;

	lzma_next_end(&coder->next, allocator);

	lzma_free(coder->mf.son, allocator);
	lzma_free(coder->mf.hash, allocator);
	lzma_free(coder->mf.buffer, allocator);

	if (coder->lz.end != NULL)
		coder->lz.end(coder->lz.coder, allocator);
	else
		lzma_free(coder->lz.coder, allocator);

	lzma_free(coder, allocator);
	return;
}